

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O3

int Aig_ManCountReprs(Aig_Man_t *p)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  iVar1 = 0;
  if (p->pReprs != (Aig_Obj_t **)0x0) {
    lVar2 = (long)p->vObjs->nSize;
    iVar1 = 0;
    if (0 < lVar2) {
      lVar3 = 0;
      iVar1 = 0;
      do {
        if (p->vObjs->pArray[lVar3] != (void *)0x0) {
          iVar1 = (iVar1 + 1) - (uint)(p->pReprs[lVar3] == (Aig_Obj_t *)0x0);
        }
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
    }
  }
  return iVar1;
}

Assistant:

int Aig_ManCountReprs( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    if ( p->pReprs == NULL )
        return 0;
    Aig_ManForEachObj( p, pObj, i )
        Counter += (p->pReprs[i] != NULL);
    return Counter;
}